

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_MemoryWarningPluginCanBeSetToDestroyTheGlobalDetector_Test
::testBody(TEST_MemoryLeakWarningGlobalDetectorTest_MemoryWarningPluginCanBeSetToDestroyTheGlobalDetector_Test
           *this)

{
  bool bVar1;
  MemoryLeakWarningPlugin *this_00;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_28;
  MemoryLeakWarningPlugin *local_18;
  MemoryLeakWarningPlugin *plugin;
  TEST_MemoryLeakWarningGlobalDetectorTest_MemoryWarningPluginCanBeSetToDestroyTheGlobalDetector_Test
  *this_local;
  
  plugin = (MemoryLeakWarningPlugin *)this;
  this_00 = (MemoryLeakWarningPlugin *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x104);
  SimpleString::SimpleString(&local_28,"dummy");
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin(this_00,&local_28,(MemoryLeakDetector *)0x0);
  SimpleString::~SimpleString(&local_28);
  local_18 = this_00;
  MemoryLeakWarningPlugin::destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor
            (this_00,true);
  MemoryLeakWarningPlugin::setGlobalDetector
            (&((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
              dummyDetector)->super_MemoryLeakDetector,
             (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyReporter
            );
  if (local_18 != (MemoryLeakWarningPlugin *)0x0) {
    (*(local_18->super_TestPlugin)._vptr_TestPlugin[1])();
  }
  pUVar2 = UtestShell::getCurrent();
  bVar1 = DummyMemoryLeakDetector::wasDeleted();
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","DummyMemoryLeakDetector::wasDeleted()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x10a,pTVar3);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, MemoryWarningPluginCanBeSetToDestroyTheGlobalDetector)
{
    MemoryLeakWarningPlugin* plugin = new MemoryLeakWarningPlugin("dummy");
    plugin->destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor(true);
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    delete plugin;

    CHECK(DummyMemoryLeakDetector::wasDeleted());
}